

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

bool __thiscall
LLVMBC::ModuleParseContext::parse_type(ModuleParseContext *this,BlockOrRecord *child)

{
  LLVMContext *context;
  undefined8 uVar1;
  ulong uVar2;
  Type *pTVar3;
  size_type sVar4;
  const_reference pvVar5;
  void *pvVar6;
  char local_10c8 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Type *local_b8;
  Type *func_type;
  ulong local_a8;
  size_t i_1;
  Vector<Type_*> argument_types;
  Type *elem_type_1;
  Type *local_68;
  uint local_60;
  uint local_5c;
  uint i;
  uint num_members;
  Vector<Type_*> members;
  value_type bit_width;
  Type *elem_type;
  Type *pointee_type;
  Type *type;
  BlockOrRecord *child_local;
  ModuleParseContext *this_local;
  
  pointee_type = (Type *)0x0;
  switch(child->id) {
  case 1:
  case 0x13:
    this_local._7_1_ = 1;
    goto LAB_0023b5d3;
  case 2:
    pointee_type = Type::getVoidTy(this->context);
    break;
  case 3:
    pointee_type = Type::getFloatTy(this->context);
    break;
  case 4:
    pointee_type = Type::getDoubleTy(this->context);
    break;
  case 5:
    pointee_type = Type::getLabelTy(this->context);
    break;
  case 6:
    pointee_type = Type::getOpaqueTy(this->context);
    break;
  case 7:
    sVar4 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                      (&child->ops);
    if (sVar4 == 0) {
      this_local._7_1_ = 0;
      goto LAB_0023b5d3;
    }
    pvVar5 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::operator[]
                       (&child->ops,0);
    members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*pvVar5;
    if ((pointer)0x40 <
        members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      this_local._7_1_ = 0;
      goto LAB_0023b5d3;
    }
    pointee_type = Type::getIntTy(this->context,
                                  (uint32_t)
                                  members.
                                  super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    break;
  case 8:
    sVar4 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                      (&child->ops);
    if (sVar4 < 2) {
      this_local._7_1_ = 0;
      goto LAB_0023b5d3;
    }
    pvVar5 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::operator[]
                       (&child->ops,0);
    pTVar3 = get_type(this,*pvVar5);
    if (pTVar3 == (Type *)0x0) {
      this_local._7_1_ = 0;
      goto LAB_0023b5d3;
    }
    pvVar5 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::operator[]
                       (&child->ops,1);
    pointee_type = &PointerType::get(pTVar3,(uint)*pvVar5)->super_Type;
    break;
  default:
    buffer._4088_8_ = dxil_spv::get_thread_log_callback();
    if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
      fprintf(_stderr,"[ERROR]: Unknown type!\n");
      fflush(_stderr);
    }
    else {
      snprintf(local_10c8,0x1000,"Unknown type!\n");
      uVar1 = buffer._4088_8_;
      pvVar6 = dxil_spv::get_thread_log_callback_userdata();
      (*(code *)uVar1)(pvVar6,2,local_10c8);
    }
    this_local._7_1_ = 0;
    goto LAB_0023b5d3;
  case 10:
    pointee_type = Type::getHalfTy(this->context);
    break;
  case 0xb:
    sVar4 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                      (&child->ops);
    if (sVar4 < 2) {
      this_local._7_1_ = 0;
      goto LAB_0023b5d3;
    }
    pvVar5 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::operator[]
                       (&child->ops,1);
    pTVar3 = get_type(this,*pvVar5);
    if (pTVar3 == (Type *)0x0) {
      this_local._7_1_ = 0;
      goto LAB_0023b5d3;
    }
    pvVar5 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::operator[]
                       (&child->ops,0);
    pointee_type = &ArrayType::get(pTVar3,*pvVar5)->super_Type;
    break;
  case 0xc:
    sVar4 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                      (&child->ops);
    if (sVar4 < 2) {
      this_local._7_1_ = 0;
      goto LAB_0023b5d3;
    }
    pvVar5 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::operator[]
                       (&child->ops,1);
    argument_types.
    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)get_type(this,*pvVar5);
    if ((Type *)argument_types.
                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage == (Type *)0x0) {
      this_local._7_1_ = 0;
      goto LAB_0023b5d3;
    }
    pvVar5 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::operator[]
                       (&child->ops,0);
    pointee_type = &VectorType::get((uint)*pvVar5,
                                    (Type *)argument_types.
                                            super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                    super_Type;
    break;
  case 0x10:
    pointee_type = Type::getMetadataTy(this->context);
    break;
  case 0x12:
  case 0x14:
    sVar4 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                      (&child->ops);
    if (sVar4 == 0) {
      this_local._7_1_ = 0;
      goto LAB_0023b5d3;
    }
    std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::vector
              ((vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *)&i);
    sVar4 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                      (&child->ops);
    local_5c = (int)sVar4 - 1;
    std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::reserve
              ((vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *)&i,
               (ulong)local_5c);
    for (local_60 = 0; local_60 < local_5c; local_60 = local_60 + 1) {
      pvVar5 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
               operator[](&child->ops,(ulong)(local_60 + 1));
      local_68 = get_type(this,*pvVar5);
      std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::push_back
                ((vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *)&i,
                 &local_68);
    }
    context = this->context;
    std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::vector
              ((vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *)
               &elem_type_1,
               (vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *)&i);
    pointee_type = &StructType::get(context,(Vector<Type_*> *)&elem_type_1)->super_Type;
    std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::~vector
              ((vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *)
               &elem_type_1);
    std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::~vector
              ((vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *)&i);
    break;
  case 0x15:
    sVar4 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                      (&child->ops);
    if (sVar4 < 2) {
      this_local._7_1_ = 0;
      goto LAB_0023b5d3;
    }
    std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::vector
              ((vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *)&i_1);
    sVar4 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                      (&child->ops);
    std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::reserve
              ((vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *)&i_1,
               sVar4 - 2);
    for (local_a8 = 2; uVar2 = local_a8,
        sVar4 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                          (&child->ops), uVar2 < sVar4; local_a8 = local_a8 + 1) {
      pvVar5 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
               operator[](&child->ops,local_a8);
      func_type = get_type(this,*pvVar5);
      std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::push_back
                ((vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *)&i_1,
                 &func_type);
    }
    pvVar5 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::operator[]
                       (&child->ops,1);
    local_b8 = get_type(this,*pvVar5);
    if (local_b8 == (Type *)0x0) {
      this_local._7_1_ = 0;
      cb._4_4_ = 1;
    }
    else {
      pointee_type = &LLVMContext::
                      construct<LLVMBC::FunctionType,LLVMBC::LLVMContext&,LLVMBC::Type*&,std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>>
                                (this->context,this->context,&local_b8,
                                 (vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                                  *)&i_1)->super_Type;
      cb._4_4_ = 2;
    }
    std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::~vector
              ((vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *)&i_1);
    if (cb._4_4_ == 1) goto LAB_0023b5d3;
  }
  add_type(this,pointee_type);
  this_local._7_1_ = 1;
LAB_0023b5d3:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ModuleParseContext::parse_type(const BlockOrRecord &child)
{
	Type *type = nullptr;
	switch (TypeRecord(child.id))
	{
	case TypeRecord::NUMENTRY:
	case TypeRecord::STRUCT_NAME:
		return true;

	case TypeRecord::VOID_TYPE:
		type = Type::getVoidTy(*context);
		break;

	case TypeRecord::HALF:
		type = Type::getHalfTy(*context);
		break;

	case TypeRecord::FLOAT:
		type = Type::getFloatTy(*context);
		break;

	case TypeRecord::DOUBLE:
		type = Type::getDoubleTy(*context);
		break;

	case TypeRecord::POINTER:
	{
		if (child.ops.size() < 2)
			return false;

		auto *pointee_type = get_type(child.ops[0]);
		if (!pointee_type)
			return false;
		type = PointerType::get(pointee_type, child.ops[1]);
		break;
	}

	case TypeRecord::ARRAY:
	{
		if (child.ops.size() < 2)
			return false;

		auto *elem_type = get_type(child.ops[1]);
		if (!elem_type)
			return false;
		type = ArrayType::get(elem_type, child.ops[0]);
		break;
	}

	case TypeRecord::INTEGER:
	{
		if (child.ops.size() < 1)
			return false;

		auto bit_width = child.ops[0];
		if (bit_width <= 64)
			type = Type::getIntTy(*context, unsigned(bit_width));
		else
			return false;
		break;
	}

	case TypeRecord::STRUCT_NAMED:
	case TypeRecord::STRUCT_ANON:
	{
		if (child.ops.size() < 1)
			return false;

		Vector<Type *> members;
		unsigned num_members = child.ops.size() - 1;
		members.reserve(num_members);
		for (unsigned i = 0; i < num_members; i++)
			members.push_back(get_type(child.ops[i + 1]));
		type = StructType::get(*context, std::move(members));
		break;
	}

	case TypeRecord::VECTOR:
	{
		if (child.ops.size() < 2)
			return false;

		auto *elem_type = get_type(child.ops[1]);
		if (!elem_type)
			return false;
		type = VectorType::get(child.ops[0], elem_type);
		break;
	}

	case TypeRecord::FUNCTION:
	{
		if (child.ops.size() < 2)
			return false;
		Vector<Type *> argument_types;
		argument_types.reserve(child.ops.size() - 2);
		for (size_t i = 2; i < child.ops.size(); i++)
			argument_types.push_back(get_type(child.ops[i]));

		auto *func_type = get_type(child.ops[1]);
		if (!func_type)
			return false;

		type = context->construct<FunctionType>(*context, func_type, std::move(argument_types));
		break;
	}

	case TypeRecord::LABEL:
	{
		type = Type::getLabelTy(*context);
		break;
	}

	case TypeRecord::METADATA:
	{
		type = Type::getMetadataTy(*context);
		break;
	}

	case TypeRecord::OPAQUE_TYPE:
	{
		type = Type::getOpaqueTy(*context);
		break;
	}

	default:
		LOGE("Unknown type!\n");
		return false;
	}

	add_type(type);
	return true;
}